

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentsHelper.cxx
# Opt level: O2

void __thiscall
cmCAStringVector::cmCAStringVector
          (cmCAStringVector *this,cmCommandArgumentsHelper *args,char *key,
          cmCommandArgumentGroup *group)

{
  uint uVar1;
  
  cmCommandArgument::cmCommandArgument(&this->super_cmCommandArgument,args,key,group);
  (this->super_cmCommandArgument)._vptr_cmCommandArgument =
       (_func_int **)&PTR__cmCAStringVector_0066d050;
  (this->Vector).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Vector).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Vector).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->Ignore = (char *)0x0;
  uVar1 = 0;
  if (key != (char *)0x0) {
    uVar1 = (uint)(*key != '\0');
  }
  this->DataStart = uVar1;
  return;
}

Assistant:

cmCAStringVector::cmCAStringVector(cmCommandArgumentsHelper* args,
                                   const char* key,
                                   cmCommandArgumentGroup* group)
:cmCommandArgument(args, key, group)
,Ignore(0)
{
  if ((key==0) || (*key==0))
    {
    this->DataStart = 0;
    }
  else
    {
    this->DataStart = 1;
    }
}